

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O2

int do_mov(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char *pcVar5;
  vm_register *pvVar6;
  undefined4 *puVar7;
  uint *puVar8;
  undefined2 uVar9;
  uint uVar10;
  byte bVar11;
  char cVar12;
  int16_t pram;
  long lVar13;
  int iVar14;
  
  pcVar5 = data_ptr;
  pvVar6 = registe_ptr;
  uVar10 = registe_ptr->IP;
  if (10 < (code_ptr[uVar10 + 1] & 0xfU)) goto switchD_00102d40_caseD_4;
  bVar1 = code_ptr[uVar10 + 2];
  bVar2 = bVar1 >> 4;
  bVar11 = bVar1 & 0xf;
  switch(code_ptr[uVar10 + 1] & 0xfU) {
  case 0:
    bVar3 = (byte)code_ptr[uVar10 + 3] >> 4;
    if (bVar11 == 2) {
      uVar10 = *register_list[bVar3];
      *register_list[bVar2] = uVar10;
LAB_0010322d:
      set_flag(uVar10);
      return 1;
    }
    if (bVar11 == 1) {
      pram = (int16_t)*register_list[bVar3];
      *(int16_t *)register_list[bVar2] = pram;
LAB_00103192:
      set_flag(pram);
      return 1;
    }
    if ((bVar1 & 0xf) == 0) {
      cVar12 = (char)*register_list[bVar3];
      *(char *)register_list[bVar2] = cVar12;
LAB_00102ffd:
      set_flag(cVar12);
      return 1;
    }
    break;
  case 1:
    if (bVar11 == 2) {
      uVar10 = *(uint *)(code_ptr + (ulong)uVar10 + 3);
      *register_list[bVar2] = uVar10;
      goto LAB_0010322d;
    }
    if (bVar11 == 1) {
      pram = *(int16_t *)(code_ptr + (ulong)uVar10 + 3);
      *(int16_t *)register_list[bVar2] = pram;
      goto LAB_00103192;
    }
    if ((bVar1 & 0xf) == 0) {
      cVar12 = code_ptr[uVar10 + 3];
      *(char *)register_list[bVar2] = cVar12;
      goto LAB_00102ffd;
    }
    break;
  case 2:
    bVar3 = (byte)code_ptr[uVar10 + 3] >> 4;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar11 == 2) {
      uVar10 = *(uint *)(data_ptr + *register_list[bVar3]);
LAB_00103155:
      puVar8 = register_list[bVar2];
      goto LAB_001031c6;
    }
    if (bVar11 == 1) {
      uVar9 = *(undefined2 *)(data_ptr + *register_list[bVar3]);
LAB_001030df:
      puVar8 = register_list[bVar2];
      goto LAB_00103113;
    }
    if ((bVar1 & 0xf) != 0) break;
    cVar12 = data_ptr[*register_list[bVar3]];
    goto LAB_00102ec4;
  case 3:
    bVar1 = code_ptr[uVar10 + 3];
    bVar11 = bVar1 >> 4;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if ((bVar1 & 0xf) == 2) {
      *(uint *)(data_ptr + *register_list[bVar2]) = *register_list[bVar11];
    }
    else if ((bVar1 & 0xf) == 1) {
      *(short *)(data_ptr + *register_list[bVar2]) = (short)*register_list[bVar11];
    }
    else {
      if ((bVar1 & 0xf) != 0) break;
      data_ptr[*register_list[bVar2]] = (char)*register_list[bVar11];
      pvVar6 = registe_ptr;
    }
    goto LAB_001032db;
  case 7:
    bVar3 = (byte)code_ptr[uVar10 + 3] >> 4;
    iVar14 = (int)*(short *)(code_ptr + (ulong)uVar10 + 5);
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar11 == 2) {
      uVar10 = *(uint *)(data_ptr + (ulong)*register_list[bVar3] + (long)iVar14);
      goto LAB_00103155;
    }
    if (bVar11 == 1) {
      uVar9 = *(undefined2 *)(data_ptr + (ulong)*register_list[bVar3] + (long)iVar14);
      goto LAB_001030df;
    }
    if ((bVar1 & 0xf) != 0) break;
    cVar12 = data_ptr[iVar14 + *register_list[bVar3]];
LAB_00102ec4:
    *(char *)register_list[bVar2] = cVar12;
    pvVar6 = registe_ptr;
LAB_001031c8:
    if (pvVar6->flag[0xe] != '\x01') {
      return 1;
    }
    data_ptr = pcVar5;
    return 1;
  case 8:
    bVar1 = code_ptr[uVar10 + 6];
    bVar11 = bVar1 >> 4;
    lVar13 = (long)*(short *)(code_ptr + (ulong)uVar10 + 4);
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if ((bVar1 & 0xf) == 2) {
      *(uint *)(data_ptr + (ulong)*register_list[bVar2] + lVar13) = *register_list[bVar11];
    }
    else if ((bVar1 & 0xf) == 1) {
      *(short *)(data_ptr + (ulong)*register_list[bVar2] + lVar13) = (short)*register_list[bVar11];
    }
    else {
      if ((bVar1 & 0xf) != 0) {
        return 1;
      }
      data_ptr[(ulong)*register_list[bVar2] + lVar13] = (char)*register_list[bVar11];
      pvVar6 = registe_ptr;
    }
    goto LAB_001032db;
  case 9:
    bVar3 = (byte)code_ptr[uVar10 + 3] >> 4;
    bVar1 = code_ptr[uVar10 + 4];
    bVar11 = bVar1 >> 4;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if ((bVar1 & 0xf) == 2) {
      *(uint *)(data_ptr + (ulong)*register_list[bVar3] + (ulong)*register_list[bVar2]) =
           *register_list[bVar11];
    }
    else if ((bVar1 & 0xf) == 1) {
      *(short *)(data_ptr + (ulong)*register_list[bVar3] + (ulong)*register_list[bVar2]) =
           (short)*register_list[bVar11];
    }
    else {
      if ((bVar1 & 0xf) != 0) break;
      data_ptr[(ulong)*register_list[bVar3] + (ulong)*register_list[bVar2]] =
           (char)*register_list[bVar11];
      pvVar6 = registe_ptr;
    }
LAB_001032db:
    if (pvVar6->flag[0xe] == '\x01') {
      data_ptr = pcVar5;
    }
    return 1;
  case 10:
    bVar3 = (byte)code_ptr[uVar10 + 3] >> 4;
    bVar4 = (byte)code_ptr[uVar10 + 4] >> 4;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar11 != 2) {
      if (bVar11 != 1) {
        if ((bVar1 & 0xf) != 0) break;
        *(char *)register_list[bVar2] =
             data_ptr[(ulong)*register_list[bVar3] + (ulong)*register_list[bVar4]];
        pvVar6 = registe_ptr;
        goto LAB_001031c8;
      }
      puVar8 = register_list[bVar2];
      uVar9 = *(undefined2 *)
               (data_ptr + (ulong)*register_list[bVar3] + (ulong)*register_list[bVar4]);
LAB_00103113:
      *(undefined2 *)puVar8 = uVar9;
      goto LAB_001031c8;
    }
    puVar8 = register_list[bVar2];
    uVar10 = *(uint *)(data_ptr + (ulong)*register_list[bVar3] + (ulong)*register_list[bVar4]);
LAB_001031c6:
    *puVar8 = uVar10;
    goto LAB_001031c8;
  }
switchD_00102d40_caseD_4:
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0xf6;
  __cxa_throw(puVar7,&int::typeinfo,0);
}

Assistant:

int do_mov() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low= (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;

	uint8_t o_low = (uint8_t)code_ptr[registe_ptr->IP + 1] % 0x10;

	switch (o_low)//操作类型
	{
	case '\x00': {//mov R,R  ---->0
		//
		uint8_t highb = (uint8_t)(code_ptr[registe_ptr->IP + 3]) / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x01': {//mov R,i   ----->1
		if (low == 0)//低位运算
		{
			unsigned temp = code_ptr[registe_ptr->IP + 2 + 1];//获得立即数
			char *R = (char *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(short*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x02': {//R,[R] ----->2
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			char temp = data_ptr[value];//获取数据段的内容
			char *R = (char *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			int16_t temp = *(int16_t*)(data_ptr + value);//获取数据段的内容
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			unsigned temp = *(unsigned*)(data_ptr + value);//获取数据段的内容
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x03': {//[R],R----->3
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			char *temp = data_ptr + value;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x07': {//R, [R + i]----->07
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		short i = *(short*)(code_ptr + registe_ptr->IP + 5);//获取立即数

		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			char temp = data_ptr[i + value];//获取数据段的内容
			char *R = (char *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			int16_t temp = *(int16_t*)(data_ptr + i + value);//获取数据段的内容
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			unsigned temp = *(unsigned*)(data_ptr + i + value);//获取数据段的内容
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x08': {//[R+i],R----->08
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 6] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 6] / 0x10;
		short i = *(short*)(code_ptr + registe_ptr->IP + 4);//获取立即数

		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			char *temp = data_ptr + i + value;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + i + value);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + i + value);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		break;
	}
	case'\x09': {//mov [R+R],R----->09
		uint8_t lowb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 4] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 4] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			char *temp = data_ptr + value + value1;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value + value1);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value + value1);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x0a': {//mov R,[R+R]----->0a
		uint8_t lowb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 4] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 4] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			char *temp = data_ptr + value + value1;//获取数据指针
			char *R = (char *)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value + value1);//获取数据指针
			int16_t *R = (int16_t*)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value + value1);//获取数据指针
			unsigned *R = (unsigned*)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}

	}
	default: {
		throw(LVM_EXECUTE_ERROR);
		break;
	}
	}
	return LVM_SUCCESS;

}